

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int check_sbit(spng_sbit *sbit,spng_ihdr *ihdr)

{
  byte local_21;
  uint8_t bit_depth;
  spng_ihdr *ihdr_local;
  spng_sbit *sbit_local;
  
  if ((sbit == (spng_sbit *)0x0) || (ihdr == (spng_ihdr *)0x0)) {
    return 1;
  }
  if (ihdr->color_type == '\0') {
    if (sbit->grayscale_bits == '\0') {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->grayscale_bits) {
      return 0x29;
    }
  }
  else if ((ihdr->color_type == '\x02') || (ihdr->color_type == '\x03')) {
    if (sbit->red_bits == '\0') {
      return 0x29;
    }
    if (sbit->green_bits == '\0') {
      return 0x29;
    }
    if (sbit->blue_bits == '\0') {
      return 0x29;
    }
    if (ihdr->color_type == '\x03') {
      local_21 = 8;
    }
    else {
      local_21 = ihdr->bit_depth;
    }
    if (local_21 < sbit->red_bits) {
      return 0x29;
    }
    if (local_21 < sbit->green_bits) {
      return 0x29;
    }
    if (local_21 < sbit->blue_bits) {
      return 0x29;
    }
  }
  else if (ihdr->color_type == '\x04') {
    if (sbit->grayscale_bits == '\0') {
      return 0x29;
    }
    if (sbit->alpha_bits == '\0') {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->grayscale_bits) {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->alpha_bits) {
      return 0x29;
    }
  }
  else if (ihdr->color_type == '\x06') {
    if (sbit->red_bits == '\0') {
      return 0x29;
    }
    if (sbit->green_bits == '\0') {
      return 0x29;
    }
    if (sbit->blue_bits == '\0') {
      return 0x29;
    }
    if (sbit->alpha_bits == '\0') {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->red_bits) {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->green_bits) {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->blue_bits) {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->alpha_bits) {
      return 0x29;
    }
  }
  return 0;
}

Assistant:

static int check_sbit(const struct spng_sbit *sbit, const struct spng_ihdr *ihdr)
{
    if(sbit == NULL || ihdr == NULL) return 1;

    if(ihdr->color_type == 0)
    {
        if(sbit->grayscale_bits == 0) return SPNG_ESBIT;
        if(sbit->grayscale_bits > ihdr->bit_depth) return SPNG_ESBIT;
    }
    else if(ihdr->color_type == 2 || ihdr->color_type == 3)
    {
        if(sbit->red_bits == 0) return SPNG_ESBIT;
        if(sbit->green_bits == 0) return SPNG_ESBIT;
        if(sbit->blue_bits == 0) return SPNG_ESBIT;

        uint8_t bit_depth;
        if(ihdr->color_type == 3) bit_depth = 8;
        else bit_depth = ihdr->bit_depth;

        if(sbit->red_bits > bit_depth) return SPNG_ESBIT;
        if(sbit->green_bits > bit_depth) return SPNG_ESBIT;
        if(sbit->blue_bits > bit_depth) return SPNG_ESBIT;
    }
    else if(ihdr->color_type == 4)
    {
        if(sbit->grayscale_bits == 0) return SPNG_ESBIT;
        if(sbit->alpha_bits == 0) return SPNG_ESBIT;

        if(sbit->grayscale_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->alpha_bits > ihdr->bit_depth) return SPNG_ESBIT;
    }
    else if(ihdr->color_type == 6)
    {
        if(sbit->red_bits == 0) return SPNG_ESBIT;
        if(sbit->green_bits == 0) return SPNG_ESBIT;
        if(sbit->blue_bits == 0) return SPNG_ESBIT;
        if(sbit->alpha_bits == 0) return SPNG_ESBIT;

        if(sbit->red_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->green_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->blue_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->alpha_bits > ihdr->bit_depth) return SPNG_ESBIT;
    }

    return 0;
}